

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall gulps::gulps_output::add_filter(gulps_output *this,filter_fun filter)

{
  filter_fun local_18;
  filter_fun filter_local;
  gulps_output *this_local;
  
  local_18 = filter;
  filter_local = (filter_fun)this;
  std::vector<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>::
  push_back(&this->filters,&local_18);
  return;
}

Assistant:

void add_filter(filter_fun filter) { filters.push_back(filter); }